

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGuiTextFilter::TextRange::split
          (TextRange *this,char separator,ImVector<ImGuiTextFilter::TextRange> *out)

{
  int iVar1;
  TextRange *pTVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  
  if (out->Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pTVar2 = (TextRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    if (out->Data != (TextRange *)0x0) {
      memcpy(pTVar2,out->Data,(long)out->Size << 4);
      if (out->Data != (TextRange *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(out->Data,GImAllocatorUserData);
    }
    out->Data = pTVar2;
    out->Capacity = 0;
  }
  out->Size = 0;
  pcVar4 = this->b;
  pcVar3 = this->e;
  if (pcVar4 < pcVar3) {
    iVar7 = 0;
    pcVar5 = pcVar4;
    do {
      if (*pcVar4 == separator) {
        if (iVar7 == out->Capacity) {
          if (iVar7 == 0) {
            iVar1 = 8;
          }
          else {
            iVar1 = iVar7 / 2 + iVar7;
          }
          iVar6 = iVar7 + 1;
          if (iVar7 + 1 < iVar1) {
            iVar6 = iVar1;
          }
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
          pTVar2 = (TextRange *)(*GImAllocatorAllocFunc)((long)iVar6 << 4,GImAllocatorUserData);
          if (out->Data != (TextRange *)0x0) {
            memcpy(pTVar2,out->Data,(long)out->Size << 4);
            if (out->Data != (TextRange *)0x0) {
              GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
            }
            (*GImAllocatorFreeFunc)(out->Data,GImAllocatorUserData);
          }
          out->Data = pTVar2;
          out->Capacity = iVar6;
          iVar7 = out->Size;
        }
        else {
          pTVar2 = out->Data;
        }
        pTVar2[iVar7].b = pcVar5;
        pTVar2[iVar7].e = pcVar4;
        iVar7 = out->Size + 1;
        out->Size = iVar7;
        pcVar5 = pcVar4 + 1;
        pcVar3 = this->e;
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar3);
    if (pcVar4 != pcVar5) {
      if (iVar7 == out->Capacity) {
        if (iVar7 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar7 / 2 + iVar7;
        }
        iVar6 = iVar7 + 1;
        if (iVar7 + 1 < iVar1) {
          iVar6 = iVar1;
        }
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pTVar2 = (TextRange *)(*GImAllocatorAllocFunc)((long)iVar6 << 4,GImAllocatorUserData);
        if (out->Data != (TextRange *)0x0) {
          memcpy(pTVar2,out->Data,(long)out->Size << 4);
          if (out->Data != (TextRange *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(out->Data,GImAllocatorUserData);
        }
        out->Data = pTVar2;
        out->Capacity = iVar6;
        iVar7 = out->Size;
      }
      else {
        pTVar2 = out->Data;
      }
      pTVar2[iVar7].b = pcVar5;
      pTVar2[iVar7].e = pcVar4;
      out->Size = out->Size + 1;
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::TextRange::split(char separator, ImVector<TextRange>& out)
{
    out.resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out.push_back(TextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out.push_back(TextRange(wb, we));
}